

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_handle.c
# Opt level: O2

void skynet_handle_init(int harbor)

{
  handle_storage *phVar1;
  skynet_context **ppsVar2;
  handle_name *phVar3;
  
  if (H == (handle_storage *)0x0) {
    phVar1 = (handle_storage *)malloc(0x30);
    phVar1->slot_size = 4;
    ppsVar2 = (skynet_context **)calloc(1,0x20);
    phVar1->slot = ppsVar2;
    (phVar1->lock).write = 0;
    (phVar1->lock).read = 0;
    phVar1->harbor = harbor << 0x18;
    phVar1->handle_index = 1;
    phVar1->name_cap = 2;
    phVar1->name_count = 0;
    phVar3 = (handle_name *)malloc(0x20);
    phVar1->name = phVar3;
    H = phVar1;
    return;
  }
  __assert_fail("H==NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_handle.c"
                ,0xf4,"void skynet_handle_init(int)");
}

Assistant:

void 
skynet_handle_init(int harbor) {
	assert(H==NULL);
	struct handle_storage * s = skynet_malloc(sizeof(*H));
	s->slot_size = DEFAULT_SLOT_SIZE;
	s->slot = skynet_malloc(s->slot_size * sizeof(struct skynet_context *));
	memset(s->slot, 0, s->slot_size * sizeof(struct skynet_context *));

	rwlock_init(&s->lock);
	// reserve 0 for system
	s->harbor = (uint32_t) (harbor & 0xff) << HANDLE_REMOTE_SHIFT;
	s->handle_index = 1;
	s->name_cap = 2;
	s->name_count = 0;
	s->name = skynet_malloc(s->name_cap * sizeof(struct handle_name));

	H = s;

	// Don't need to free H
}